

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void freegroup(rnngroup *group)

{
  int local_14;
  int i;
  rnngroup *group_local;
  
  free(group->name);
  for (local_14 = 0; local_14 < group->subelemsnum; local_14 = local_14 + 1) {
    freedelem(group->subelems[local_14]);
  }
  free(group->subelems);
  free(group);
  return;
}

Assistant:

static void freegroup(struct rnngroup *group) {
	int i;
	free(group->name);

	for (i = 0; i < group->subelemsnum; i++)
		freedelem(group->subelems[i]);
	free(group->subelems);
	free(group);
}